

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O3

xpath_ast_node * __thiscall
pugi::impl::anon_unknown_0::xpath_parser::parse_expression_rec
          (xpath_parser *this,xpath_ast_node *lhs,int limit)

{
  xpath_lexer *lexer;
  xpath_parse_result *pxVar1;
  ulong uVar2;
  xpath_ast_node *lhs_00;
  xpath_ast_node *pxVar3;
  char *pcVar4;
  int limit_00;
  binary_op_t bVar5;
  binary_op_t bVar6;
  xpath_ast_node *local_40;
  
  lexer = &this->_lexer;
  bVar5 = binary_op_t::parse(lexer);
  local_40 = lhs;
  if (limit <= bVar5.precedence && bVar5.asttype != ast_unknown) {
    while( true ) {
      xpath_lexer::next(lexer);
      uVar2 = this->_depth + 1;
      this->_depth = uVar2;
      if (0x400 < uVar2) break;
      lhs_00 = parse_path_or_unary_expression(this);
      if (lhs_00 == (xpath_ast_node *)0x0) goto LAB_00164a5a;
      bVar6 = binary_op_t::parse(lexer);
      limit_00 = bVar6.precedence;
      if (bVar5.precedence < limit_00 && bVar6.asttype != ast_unknown) {
        do {
          lhs_00 = parse_expression_rec(this,lhs_00,limit_00);
          if (lhs_00 == (xpath_ast_node *)0x0) goto LAB_00164a5a;
          bVar6 = binary_op_t::parse(lexer);
          limit_00 = bVar6.precedence;
        } while ((bVar6.asttype != ast_unknown) && (bVar5.precedence < limit_00));
      }
      if (bVar5.asttype == ast_op_union) {
        if ((local_40->_rettype != '\x01') || (lhs_00->_rettype != '\x01')) {
          pcVar4 = "Union operator has to be applied to node sets";
          goto LAB_00164a47;
        }
        pxVar3 = (xpath_ast_node *)xpath_allocator::allocate(this->_alloc,0x28);
        if (pxVar3 == (xpath_ast_node *)0x0) goto LAB_00164a5a;
        pxVar3->_type = '\x0f';
      }
      else {
        pxVar3 = (xpath_ast_node *)xpath_allocator::allocate(this->_alloc,0x28);
        if (pxVar3 == (xpath_ast_node *)0x0) goto LAB_00164a5a;
        pxVar3->_type = (char)bVar5.asttype;
      }
      pxVar3->_rettype = (char)bVar5.rettype;
      pxVar3->_axis = '\0';
      pxVar3->_test = '\0';
      pxVar3->_left = local_40;
      pxVar3->_right = lhs_00;
      pxVar3->_next = (xpath_ast_node *)0x0;
      bVar5 = binary_op_t::parse(lexer);
      if (bVar5.asttype == ast_unknown) {
        return pxVar3;
      }
      local_40 = pxVar3;
      if (bVar5.precedence < limit) {
        return pxVar3;
      }
    }
    pcVar4 = "Exceeded maximum allowed query depth";
LAB_00164a47:
    pxVar1 = this->_result;
    pxVar1->error = pcVar4;
    pxVar1->offset = (long)(this->_lexer)._cur_lexeme_pos - (long)this->_query;
LAB_00164a5a:
    lhs = (xpath_ast_node *)0x0;
  }
  return lhs;
}

Assistant:

xpath_ast_node* parse_expression_rec(xpath_ast_node* lhs, int limit)
		{
			binary_op_t op = binary_op_t::parse(_lexer);

			while (op.asttype != ast_unknown && op.precedence >= limit)
			{
				_lexer.next();

				if (++_depth > xpath_ast_depth_limit)
					return error_rec();

				xpath_ast_node* rhs = parse_path_or_unary_expression();
				if (!rhs) return NULL;

				binary_op_t nextop = binary_op_t::parse(_lexer);

				while (nextop.asttype != ast_unknown && nextop.precedence > op.precedence)
				{
					rhs = parse_expression_rec(rhs, nextop.precedence);
					if (!rhs) return NULL;

					nextop = binary_op_t::parse(_lexer);
				}

				if (op.asttype == ast_op_union && (lhs->rettype() != xpath_type_node_set || rhs->rettype() != xpath_type_node_set))
					return error("Union operator has to be applied to node sets");

				lhs = alloc_node(op.asttype, op.rettype, lhs, rhs);
				if (!lhs) return NULL;

				op = binary_op_t::parse(_lexer);
			}

			return lhs;
		}